

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall CanSimulationDataGenerator::AddCrc(CanSimulationDataGenerator *this)

{
  size_type sVar1;
  BitState local_f4;
  BitState *local_f0;
  BitState *local_e8;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_e0;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_d8;
  const_iterator local_d0;
  BitState local_c8;
  BitState local_c4;
  uint local_c0;
  uint local_bc;
  U32 i;
  U32 mask;
  U16 crc;
  iterator iStack_b0;
  U32 bits_for_crc;
  BitState *local_a8;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_a0;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_98;
  const_iterator local_90;
  BitState *local_88;
  BitState *local_80;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_78;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_70;
  const_iterator local_68;
  BitState *local_60;
  BitState *local_58;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_50;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_48;
  const_iterator local_40;
  BitState *local_38;
  BitState *local_30;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_28;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_20;
  const_iterator local_18;
  CanSimulationDataGenerator *local_10;
  CanSimulationDataGenerator *this_local;
  
  local_10 = this;
  local_20._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeStuffedBits);
  __gnu_cxx::__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>>::
  __normal_iterator<BitState*>
            ((__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>> *)
             &local_18,&local_20);
  local_28._M_current =
       (BitState *)
       std::vector<BitState,_std::allocator<BitState>_>::begin(&this->mFakeStartOfFrameField);
  local_30 = (BitState *)
             std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeStartOfFrameField);
  local_38 = (BitState *)
             std::vector<BitState,std::allocator<BitState>>::
             insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
                       ((vector<BitState,std::allocator<BitState>> *)&this->mFakeStuffedBits,
                        local_18,local_28,
                        (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>
                         )local_30);
  local_48._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeStuffedBits);
  __gnu_cxx::__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>>::
  __normal_iterator<BitState*>
            ((__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>> *)
             &local_40,&local_48);
  local_50._M_current =
       (BitState *)
       std::vector<BitState,_std::allocator<BitState>_>::begin(&this->mFakeArbitrationField);
  local_58 = (BitState *)
             std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeArbitrationField);
  local_60 = (BitState *)
             std::vector<BitState,std::allocator<BitState>>::
             insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
                       ((vector<BitState,std::allocator<BitState>> *)&this->mFakeStuffedBits,
                        local_40,local_50,
                        (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>
                         )local_58);
  local_70._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeStuffedBits);
  __gnu_cxx::__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>>::
  __normal_iterator<BitState*>
            ((__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>> *)
             &local_68,&local_70);
  local_78._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::begin(&this->mFakeControlField)
  ;
  local_80 = (BitState *)
             std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeControlField);
  local_88 = (BitState *)
             std::vector<BitState,std::allocator<BitState>>::
             insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
                       ((vector<BitState,std::allocator<BitState>> *)&this->mFakeStuffedBits,
                        local_68,local_78,
                        (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>
                         )local_80);
  local_98._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeStuffedBits);
  __gnu_cxx::__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>>::
  __normal_iterator<BitState*>
            ((__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>> *)
             &local_90,&local_98);
  local_a0._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::begin(&this->mFakeDataField);
  local_a8 = (BitState *)
             std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeDataField);
  iStack_b0 = std::vector<BitState,std::allocator<BitState>>::
              insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
                        ((vector<BitState,std::allocator<BitState>> *)&this->mFakeStuffedBits,
                         local_90,local_a0,
                         (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>
                          )local_a8);
  sVar1 = std::vector<BitState,_std::allocator<BitState>_>::size(&this->mFakeStuffedBits);
  mask = (U32)sVar1;
  i._2_2_ = ComputeCrc(this,&this->mFakeStuffedBits,mask);
  local_bc = 0x4000;
  for (local_c0 = 0; local_c0 < 0xf; local_c0 = local_c0 + 1) {
    if ((local_bc & i._2_2_) == 0) {
      local_c4 = CanAnalyzerSettings::Dominant(this->mSettings);
      std::vector<BitState,_std::allocator<BitState>_>::push_back
                (&this->mFakeCrcFieldWithoutDelimiter,&local_c4);
    }
    else {
      local_c8 = CanAnalyzerSettings::Recessive(this->mSettings);
      std::vector<BitState,_std::allocator<BitState>_>::push_back
                (&this->mFakeCrcFieldWithoutDelimiter,&local_c8);
    }
    local_bc = local_bc >> 1;
  }
  local_d8._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeStuffedBits);
  __gnu_cxx::__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>>::
  __normal_iterator<BitState*>
            ((__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>> *)
             &local_d0,&local_d8);
  local_e0._M_current =
       (BitState *)
       std::vector<BitState,_std::allocator<BitState>_>::begin(&this->mFakeCrcFieldWithoutDelimiter)
  ;
  local_e8 = (BitState *)
             std::vector<BitState,_std::allocator<BitState>_>::end
                       (&this->mFakeCrcFieldWithoutDelimiter);
  local_f0 = (BitState *)
             std::vector<BitState,std::allocator<BitState>>::
             insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
                       ((vector<BitState,std::allocator<BitState>> *)&this->mFakeStuffedBits,
                        local_d0,local_e0,
                        (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>
                         )local_e8);
  local_f4 = CanAnalyzerSettings::Recessive(this->mSettings);
  std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeFixedFormBits,&local_f4);
  return;
}

Assistant:

void CanSimulationDataGenerator::AddCrc()
{
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeStartOfFrameField.begin(), mFakeStartOfFrameField.end() );
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeArbitrationField.begin(), mFakeArbitrationField.end() );
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeControlField.begin(), mFakeControlField.end() );
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeDataField.begin(), mFakeDataField.end() );

    U32 bits_for_crc = mFakeStuffedBits.size();
    U16 crc = ComputeCrc( mFakeStuffedBits, bits_for_crc );
    U32 mask = 0x4000;
    for( U32 i = 0; i < 15; i++ )
    {
        if( ( mask & crc ) == 0 )
            mFakeCrcFieldWithoutDelimiter.push_back( mSettings->Dominant() );
        else
            mFakeCrcFieldWithoutDelimiter.push_back( mSettings->Recessive() );

        mask >>= 1;
    }

    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeCrcFieldWithoutDelimiter.begin(), mFakeCrcFieldWithoutDelimiter.end() );

    // CRC DELIMITER (Standard Format as well as Extended Format)
    // The CRC SEQUENCE is followed by the CRC DELIMITER which consists of a single
    // recessive bit.

    mFakeFixedFormBits.push_back( mSettings->Recessive() );
}